

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

int __thiscall
crnlib::adaptive_huffman_data_model::init(adaptive_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  decoder_tables *pdVar2;
  uint in_EDX;
  uint8 uVar3;
  
  clear(this);
  this->m_encoding = SUB81(ctx,0);
  uVar3 = '\0';
  vector<unsigned_short>::resize(&this->m_sym_freq,in_EDX,false);
  vector<unsigned_char>::resize(&this->m_code_sizes,in_EDX,false);
  this->m_total_syms = in_EDX;
  if (0x10 < in_EDX) {
    uVar1 = math::ceil_log2i(in_EDX);
    uVar3 = '\v';
    if (uVar1 + 1 < 0xb) {
      uVar3 = (uint8)(uVar1 + 1);
    }
  }
  this->m_decoder_table_bits = uVar3;
  if (this->m_encoding == true) {
    vector<unsigned_short>::resize(&this->m_codes,in_EDX,false);
  }
  else {
    pdVar2 = crnlib_new<crnlib::prefix_coding::decoder_tables>();
    this->m_pDecode_tables = pdVar2;
  }
  reset(this);
  return extraout_EAX;
}

Assistant:

void adaptive_huffman_data_model::init(bool encoding, uint total_syms)
    {
        clear();

        m_encoding = encoding;

        m_sym_freq.resize(total_syms);
        m_code_sizes.resize(total_syms);

        m_total_syms = total_syms;

        if (m_total_syms <= 16)
        {
            m_decoder_table_bits = 0;
        }
        else
        {
            m_decoder_table_bits = static_cast<uint8>(math::minimum(1 + math::ceil_log2i(m_total_syms), prefix_coding::cMaxTableBits));
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);
        }
        else
        {
            m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
        }

        reset();
    }